

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HMAC.c
# Opt level: O2

void EverCrypt_HMAC_compute
               (Spec_Hash_Definitions_hash_alg a,uint8_t *mac,uint8_t *key,uint32_t keylen,
               uint8_t *data,uint32_t datalen)

{
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,a)) {
  case 1:
    EverCrypt_HMAC_compute_sha2_256(mac,key,keylen,data,datalen);
    return;
  case 2:
    EverCrypt_HMAC_compute_sha2_384(mac,key,keylen,data,datalen);
    return;
  case 3:
    EverCrypt_HMAC_compute_sha2_512(mac,key,keylen,data,datalen);
    return;
  case 4:
    EverCrypt_HMAC_compute_sha1(mac,key,keylen,data,datalen);
    return;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_HMAC.c"
            ,0x375,data,datalen,&switchD_0015de15::switchdataD_001bd260);
    exit(0xfd);
  case 6:
    EverCrypt_HMAC_compute_blake2s(mac,key,keylen,data,datalen);
    return;
  case 7:
    EverCrypt_HMAC_compute_blake2b(mac,key,keylen,data,datalen);
    return;
  }
}

Assistant:

void
EverCrypt_HMAC_compute(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *mac,
  uint8_t *key,
  uint32_t keylen,
  uint8_t *data,
  uint32_t datalen
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        EverCrypt_HMAC_compute_sha1(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_HMAC_compute_sha2_256(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        EverCrypt_HMAC_compute_sha2_384(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        EverCrypt_HMAC_compute_sha2_512(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        EverCrypt_HMAC_compute_blake2s(mac, key, keylen, data, datalen);
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        EverCrypt_HMAC_compute_blake2b(mac, key, keylen, data, datalen);
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}